

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O3

DWORD * __thiscall
HMISong::SendCommand
          (HMISong *this,DWORD *events,TrackInfo *track,DWORD delay,ptrdiff_t room,
          bool *sysex_noroom)

{
  byte *pbVar1;
  byte bVar2;
  BYTE BVar3;
  BYTE *pBVar4;
  AutoNoteOff *pAVar5;
  DWORD DVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  size_t sVar11;
  ulong uVar12;
  uint uVar13;
  DWORD *__dest;
  uint uVar14;
  
  if (this->FakeTrack == track) {
    pAVar5 = (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array;
    uVar7._0_1_ = pAVar5->Channel;
    uVar7._1_1_ = pAVar5->Key;
    uVar7._2_2_ = *(undefined2 *)&pAVar5->field_0x6;
    uVar10 = (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count;
    if (uVar10 != 0) {
      uVar10 = uVar10 - 1;
      (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count = uVar10;
      *pAVar5 = pAVar5[uVar10];
      NoteOffQueue::Heapify(&this->NoteOffs);
    }
    *events = delay;
    events[1] = 0;
    events[2] = uVar7 & 0xffff | 0x90;
LAB_0033c596:
    events = events + 3;
  }
  else {
    *sysex_noroom = false;
    uVar9 = track->TrackP;
    uVar12 = track->MaxTrackP;
    if (uVar9 < uVar12) {
      pBVar4 = track->TrackBegin;
      sVar11 = uVar9 + 1;
      track->TrackP = sVar11;
      if (sVar11 < uVar12) {
        bVar2 = pBVar4[uVar9];
        *events = delay;
        events[1] = 0;
        events[2] = 0x2000000;
        uVar7 = (uint)bVar2;
        if ((bVar2 - 0xf0 < 0x10) && ((0xc081U >> (bVar2 - 0xf0 & 0x1f) & 1) != 0)) {
          if (bVar2 < 0xfe) {
            if ((uVar7 == 0xf0) || (uVar7 == 0xf7)) {
              DVar6 = (*this->ReadVarLen)(track);
              uVar12 = (ulong)DVar6;
              if ((DVar6 < 0x5f4) && ((this->super_MIDIStreamer).DeviceType != MDEV_SNDSYS)) {
                if ((ulong)(room << 2) <= (ulong)(DVar6 + 0xc)) {
                  track->TrackP = uVar9;
                  *sysex_noroom = true;
                  return events;
                }
                if (bVar2 == 0xf0) {
                  uVar7 = DVar6 + 0x80000001;
                  __dest = (DWORD *)((long)events + 0xd);
                  *(undefined1 *)(events + 3) = 0xf0;
                }
                else {
                  __dest = events + 3;
                  uVar7 = DVar6 | 0x80000000;
                }
                events[2] = uVar7;
                memcpy(__dest,track->TrackBegin + track->TrackP,uVar12);
                if (((long)__dest + uVar12 & 3) != 0) {
                  memset((void *)((long)__dest + uVar12),0,(ulong)(~DVar6 - (int)__dest & 3) + 1);
                }
                track->TrackP = track->TrackP + uVar12;
              }
              else {
                track->TrackP = track->TrackP + uVar12;
              }
            }
          }
          else if (uVar7 == 0xfe) {
            track->TrackP = uVar9 + 2;
            if (uVar12 <= uVar9 + 2) goto LAB_0033c8bf;
            switch(pBVar4[sVar11]) {
            case '\x10':
              track->TrackP = uVar9 + 4;
              if ((uVar9 + 4 < uVar12) &&
                 (uVar9 = pBVar4[uVar9 + 4] + uVar9 + 9, track->TrackP = uVar9, uVar9 < uVar12))
              goto LAB_0033c723;
              goto LAB_0033c8bf;
            default:
              goto switchD_0033c69a_caseD_11;
            case '\x12':
            case '\x14':
              sVar11 = uVar9 + 4;
              break;
            case '\x13':
            case '\x15':
              sVar11 = uVar9 + 8;
            }
            track->TrackP = sVar11;
          }
          else if (uVar7 == 0xff) {
            track->TrackP = uVar9 + 2;
            if (uVar12 <= uVar9 + 2) goto LAB_0033c8bf;
            BVar3 = pBVar4[uVar9 + 1];
            DVar6 = (*this->ReadVarLen)(track);
            uVar9 = track->TrackP;
            uVar12 = track->MaxTrackP;
            if (uVar12 <= uVar9) {
              track->Finished = true;
              return events;
            }
            uVar8 = DVar6 + uVar9;
            if (uVar8 <= uVar12) {
              if (BVar3 == 'Q') {
                pBVar4 = track->TrackBegin;
                (this->super_MIDIStreamer).Tempo =
                     (uint)pBVar4[uVar9 + 2] |
                     (uint)pBVar4[uVar9 + 1] << 8 | (uint)pBVar4[uVar9] << 0x10;
                *events = delay;
                events[1] = 0;
                events[2] = (this->super_MIDIStreamer).Tempo | 0x1000000;
              }
              else if (BVar3 == '/') {
                track->Finished = true;
              }
              track->TrackP = uVar8;
              if (uVar8 != uVar12) goto LAB_0033c723;
            }
switchD_0033c69a_caseD_11:
            track->Finished = true;
          }
LAB_0033c723:
          if (track->Finished == false) {
            DVar6 = (*this->ReadVarLen)(track);
            track->Delay = DVar6;
          }
          if ((events[2] & 0xff000000) == 0x2000000 && *events == 0) {
            return events;
          }
          goto LAB_0033c596;
        }
        uVar10 = (uint)bVar2;
        uVar14 = uVar10;
        if ((~bVar2 & 0xf0) == 0) {
          if (MIDI_CommonLengths[uVar7 & 0xf] < '\x01') {
            uVar7 = 0;
            uVar10 = 0;
          }
          else {
            track->TrackP = uVar9 + 2;
            bVar2 = pBVar4[uVar9 + 1];
            if (MIDI_CommonLengths[uVar7 & 0xf] < '\x02') goto LAB_0033c797;
            sVar11 = uVar9 + 3;
            track->TrackP = sVar11;
            uVar7 = (uint)pBVar4[uVar9 + 2];
LAB_0033c799:
            uVar10 = (uint)bVar2;
          }
        }
        else {
          if ((char)bVar2 < '\0') {
            track->RunningStatus = bVar2;
            track->TrackP = uVar9 + 2;
            bVar2 = pBVar4[uVar9 + 1];
LAB_0033c797:
            sVar11 = uVar9 + 2;
            uVar7 = 0;
            goto LAB_0033c799;
          }
          uVar14 = (uint)track->RunningStatus;
          uVar7 = 0;
        }
        if (sVar11 < uVar12) {
          uVar13 = uVar14 & 0x70;
          if (MIDI_EventLengths[uVar13 >> 4] == '\x02') {
            track->TrackP = sVar11 + 1;
            uVar7 = (uint)pBVar4[sVar11];
          }
          if ((uVar13 == 0x30) && ((BYTE)uVar10 == '\a')) {
            uVar7 = MIDIStreamer::VolumeControllerChange
                              (&this->super_MIDIStreamer,uVar14 & 0xf,uVar7);
          }
          if ((byte)uVar14 != 0xff) {
            events[2] = ((uVar7 & 0xff) << 0x10 | uVar10 << 8) + uVar14;
          }
          if ((uVar13 == 0x10) && (this->ReadVarLen == ReadVarLenHMI)) {
            DVar6 = 0;
            sVar11 = track->TrackP;
            do {
              if (track->MaxTrackP <= sVar11) break;
              track->TrackP = sVar11 + 1;
              pbVar1 = track->TrackBegin + sVar11;
              DVar6 = DVar6 << 7 | *pbVar1 & 0x7f;
              sVar11 = sVar11 + 1;
            } while ((char)*pbVar1 < '\0');
            NoteOffQueue::AddNoteOff(&this->NoteOffs,DVar6,(byte)uVar14 & 0xf,(BYTE)uVar10);
          }
          goto LAB_0033c723;
        }
      }
    }
LAB_0033c8bf:
    track->Finished = true;
  }
  return events;
}

Assistant:

DWORD *HMISong::SendCommand (DWORD *events, TrackInfo *track, DWORD delay, ptrdiff_t room, bool &sysex_noroom)
{
	DWORD len;
	BYTE event, data1 = 0, data2 = 0;

	// If the next event comes from the fake track, pop an entry off the note-off queue.
	if (track == FakeTrack)
	{
		AutoNoteOff off;
		NoteOffs.Pop(off);
		events[0] = delay;
		events[1] = 0;
		events[2] = MIDI_NOTEON | off.Channel | (off.Key << 8);
		return events + 3;
	}

	sysex_noroom = false;
	size_t start_p = track->TrackP;

	CHECK_FINISHED
	event = track->TrackBegin[track->TrackP++];
	CHECK_FINISHED

	// The actual event type will be filled in below. If it's not a NOP,
	// the events pointer will be advanced once the actual event is written.
	// Otherwise, we do it at the end of the function.
	events[0] = delay;
	events[1] = 0;
	events[2] = MEVT_NOP << 24;

	if (event != MIDI_SYSEX && event != MIDI_META && event != MIDI_SYSEXEND && event != 0xFe)
	{
		// Normal short message
		if ((event & 0xF0) == 0xF0)
		{
			if (MIDI_CommonLengths[event & 15] > 0)
			{
				data1 = track->TrackBegin[track->TrackP++];
				if (MIDI_CommonLengths[event & 15] > 1)
				{
					data2 = track->TrackBegin[track->TrackP++];
				}
			}
		}
		else if ((event & 0x80) == 0)
		{
			data1 = event;
			event = track->RunningStatus;
		}
		else
		{
			track->RunningStatus = event;
			data1 = track->TrackBegin[track->TrackP++];
		}

		CHECK_FINISHED

		if (MIDI_EventLengths[(event&0x70)>>4] == 2)
		{
			data2 = track->TrackBegin[track->TrackP++];
		}

		// Monitor channel volume controller changes.
		if ((event & 0x70) == (MIDI_CTRLCHANGE & 0x70) && data1 == 7)
		{
			data2 = VolumeControllerChange(event & 15, data2);
		}

		if (event != MIDI_META)
		{
			events[2] = event | (data1<<8) | (data2<<16);
		}

		if (ReadVarLen == ReadVarLenHMI && (event & 0x70) == (MIDI_NOTEON & 0x70))
		{ // HMI note on events include the time until an implied note off event.
			NoteOffs.AddNoteOff(track->ReadVarLenHMI(), event & 0x0F, data1);
		}
	}
	else
	{
		// SysEx events could potentially not have enough room in the buffer...
		if (event == MIDI_SYSEX || event == MIDI_SYSEXEND)
		{
			len = ReadVarLen(track);
			if (len >= (MAX_EVENTS-1)*3*4 || DeviceType == MDEV_SNDSYS)
			{ // This message will never fit. Throw it away.
				track->TrackP += len;
			}
			else if (len + 12 >= (size_t)room * 4)
			{ // Not enough room left in this buffer. Backup and wait for the next one.
				track->TrackP = start_p;
				sysex_noroom = true;
				return events;
			}
			else
			{
				BYTE *msg = (BYTE *)&events[3];
				if (event == MIDI_SYSEX)
				{ // Need to add the SysEx marker to the message.
					events[2] = (MEVT_LONGMSG << 24) | (len + 1);
					*msg++ = MIDI_SYSEX;
				}
				else
				{
					events[2] = (MEVT_LONGMSG << 24) | len;
				}
				memcpy(msg, &track->TrackBegin[track->TrackP], len);
				msg += len;
				// Must pad with 0
				while ((size_t)msg & 3)
				{
					*msg++ = 0;
				}
				track->TrackP += len;
			}
		}
		else if (event == MIDI_META)
		{
			// It's a meta-event
			event = track->TrackBegin[track->TrackP++];
			CHECK_FINISHED
			len = ReadVarLen(track);
			CHECK_FINISHED

			if (track->TrackP + len <= track->MaxTrackP)
			{
				switch (event)
				{
				case MIDI_META_EOT:
					track->Finished = true;
					break;

				case MIDI_META_TEMPO:
					Tempo =
						(track->TrackBegin[track->TrackP+0]<<16) |
						(track->TrackBegin[track->TrackP+1]<<8)  |
						(track->TrackBegin[track->TrackP+2]);
					events[0] = delay;
					events[1] = 0;
					events[2] = (MEVT_TEMPO << 24) | Tempo;
					break;
				}
				track->TrackP += len;
				if (track->TrackP == track->MaxTrackP)
				{
					track->Finished = true;
				}
			}
			else
			{
				track->Finished = true;
			}
		}
		else if (event == 0xFE)
		{ // Skip unknown HMI events.
			event = track->TrackBegin[track->TrackP++];
			CHECK_FINISHED
			if (event == 0x13 || event == 0x15)
			{
				track->TrackP += 6;
			}
			else if (event == 0x12 || event == 0x14)
			{
				track->TrackP += 2;
			}
			else if (event == 0x10)
			{
				track->TrackP += 2;
				CHECK_FINISHED
				track->TrackP += track->TrackBegin[track->TrackP] + 5;
				CHECK_FINISHED
			}
			else
			{ // No idea.
				track->Finished = true;
			}
		}